

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O0

void * __thiscall camp::UserObject::pointer(UserObject *this)

{
  UserProperty *this_00;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ParentObject *pPVar4;
  Value local_78;
  UserObject local_40;
  UserObject *local_18;
  UserObject *this_local;
  
  local_18 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_holder);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_holder);
    iVar2 = (*peVar3->_vptr_AbstractObjectHolder[2])();
    this_local = (UserObject *)CONCAT44(extraout_var,iVar2);
  }
  else {
    bVar1 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&this->m_parent);
    if (bVar1) {
      pPVar4 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
      this_00 = pPVar4->member;
      pPVar4 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
      Property::get(&local_78,&this_00->super_Property,&pPVar4->object);
      Value::to<camp::UserObject>(&local_40,&local_78);
      pPVar4 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
      operator=(&pPVar4->lastValue,&local_40);
      ~UserObject(&local_40);
      Value::~Value(&local_78);
      pPVar4 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
      this_local = (UserObject *)pointer(&pPVar4->lastValue);
    }
    else {
      this_local = (UserObject *)0x0;
    }
  }
  return this_local;
}

Assistant:

void* UserObject::pointer() const
{
    if (m_holder)
    {
        return m_holder->object();
    }
    else if (m_parent)
    {
        // warning: this may not be multi-thread safe,
        // but it is required to make the returned value persistent
        m_parent->lastValue = m_parent->member.get(m_parent->object).to<UserObject>();
        return m_parent->lastValue.pointer();
    }
    else
    {
        return 0;
    }
}